

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

string * __thiscall
pbrt::CurveCommon::ToString_abi_cxx11_(string *__return_storage_ptr__,CurveCommon *this)

{
  Transform *args_5;
  Transform *args_6;
  span<const_pbrt::Normal3<float>_> local_48;
  span<const_float> local_38;
  span<const_pbrt::Point3<float>_> local_28;
  
  local_28.ptr = this->cpObj;
  local_38.ptr = this->width;
  local_48.ptr = this->n;
  local_28.n = 4;
  local_38.n = 2;
  local_48.n = 2;
  args_5 = this->renderFromObject;
  args_6 = this->objectFromRender;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CurveType_const&,pstd::span<pbrt::Point3<float>const>,pstd::span<float_const>,pstd::span<pbrt::Normal3<float>const>,float_const&,float_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&>
            (__return_storage_ptr__,
             "[ CurveCommon type: %s cpObj: %s width: %s n: %s normalAngle: %f invSinNormalAngle: %f renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s ]"
             ,&this->type,&local_28,&local_38,&local_48,&this->normalAngle,&this->invSinNormalAngle,
             args_5,args_6,&this->reverseOrientation,&this->transformSwapsHandedness);
  return __return_storage_ptr__;
}

Assistant:

std::string CurveCommon::ToString() const {
    return StringPrintf(
        "[ CurveCommon type: %s cpObj: %s width: %s n: %s normalAngle: %f "
        "invSinNormalAngle: %f renderFromObject: %s "
        "objectFromRender: %s "
        "reverseOrientation: %s transformSwapsHandedness: %s ]",
        type, pstd::MakeSpan(cpObj), pstd::MakeSpan(width), pstd::MakeSpan(n),
        normalAngle, invSinNormalAngle, *renderFromObject, *objectFromRender,
        reverseOrientation, transformSwapsHandedness);
}